

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::Configure(cmGlobalGenerator *this)

{
  Snapshot snapshot;
  bool bVar1;
  WorkingMode WVar2;
  cmMakefile *pcVar3;
  char *pcVar4;
  size_type sVar5;
  cmake *pcVar6;
  ostream *poVar7;
  string local_358 [39];
  allocator local_331;
  string local_330 [8];
  string f;
  char **log;
  char *logs [3];
  undefined1 local_2e8 [8];
  ostringstream msg;
  allocator local_169;
  string local_168;
  char local_148 [8];
  char num [100];
  allocator local_c1;
  value_type local_c0;
  allocator local_99;
  string local_98;
  allocator local_61;
  string local_60;
  PositionType local_40;
  Snapshot local_30;
  cmLocalGenerator *local_18;
  cmLocalGenerator *lg;
  cmGlobalGenerator *this_local;
  
  this->FirstTimeProgress = 0.0;
  lg = (cmLocalGenerator *)this;
  ClearGeneratorMembers(this);
  cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator(&local_40);
  cmState::Snapshot::Snapshot(&local_30,(cmState *)0x0,local_40);
  snapshot.Position.Tree = local_30.Position.Tree;
  snapshot.State = local_30.State;
  snapshot.Position.Position = local_30.Position.Position;
  local_18 = MakeLocalGenerator(this,snapshot,(cmLocalGenerator *)0x0);
  std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::push_back
            (&this->LocalGenerators,&local_18);
  pcVar3 = cmLocalGenerator::GetMakefile(local_18);
  pcVar4 = cmake::GetHomeDirectory(this->CMakeInstance);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,pcVar4,&local_61);
  cmMakefile::SetCurrentSourceDirectory(pcVar3,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  pcVar3 = cmLocalGenerator::GetMakefile(local_18);
  pcVar4 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,pcVar4,&local_99);
  cmMakefile::SetCurrentBinaryDirectory(pcVar3,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  pcVar4 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,pcVar4,&local_c1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&this->BinaryDirectories,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  pcVar3 = cmLocalGenerator::GetMakefile(local_18);
  cmMakefile::Configure(pcVar3);
  sVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                    (&this->LocalGenerators);
  sprintf(local_148,"%d",sVar5 & 0xffffffff);
  pcVar6 = GetCMakeInstance(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"CMAKE_NUMBER_OF_LOCAL_GENERATORS",&local_169);
  cmake::AddCacheEntry(pcVar6,&local_168,local_148,"number of local generators",4);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  CheckLocalGenerators(this);
  FillProjectMap(this);
  WVar2 = cmake::GetWorkingMode(this->CMakeInstance);
  if (WVar2 == NORMAL_MODE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
    bVar1 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar1) {
      std::operator<<((ostream *)local_2e8,"Configuring incomplete, errors occurred!");
      log = (char **)anon_var_dwarf_263851;
      logs[0] = "CMakeError.log";
      logs[1] = (char *)0x0;
      for (f.field_2._8_8_ = &log; *(long *)f.field_2._8_8_ != 0;
          f.field_2._8_8_ = f.field_2._8_8_ + 8) {
        pcVar4 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_330,pcVar4,&local_331);
        std::allocator<char>::~allocator((allocator<char> *)&local_331);
        pcVar4 = cmake::GetCMakeFilesDirectory();
        std::__cxx11::string::operator+=(local_330,pcVar4);
        std::__cxx11::string::operator+=(local_330,"/");
        std::__cxx11::string::operator+=(local_330,*(char **)f.field_2._8_8_);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::SystemTools::FileExists(pcVar4);
        if (bVar1) {
          poVar7 = std::operator<<((ostream *)local_2e8,"\nSee also \"");
          poVar7 = std::operator<<(poVar7,local_330);
          std::operator<<(poVar7,"\".");
        }
        std::__cxx11::string::~string(local_330);
      }
    }
    else {
      std::operator<<((ostream *)local_2e8,"Configuring done");
    }
    pcVar6 = this->CMakeInstance;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmake::UpdateProgress(pcVar6,pcVar4,-1.0);
    std::__cxx11::string::~string(local_358);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
  }
  return;
}

Assistant:

void cmGlobalGenerator::Configure()
{
  this->FirstTimeProgress = 0.0f;
  this->ClearGeneratorMembers();

  // start with this directory
  cmLocalGenerator *lg = this->MakeLocalGenerator();
  this->LocalGenerators.push_back(lg);

  // set the Start directories
  lg->GetMakefile()->SetCurrentSourceDirectory
    (this->CMakeInstance->GetHomeDirectory());
  lg->GetMakefile()->SetCurrentBinaryDirectory
    (this->CMakeInstance->GetHomeOutputDirectory());

  this->BinaryDirectories.insert(
      this->CMakeInstance->GetHomeOutputDirectory());

  // now do it
  lg->GetMakefile()->Configure();

  // update the cache entry for the number of local generators, this is used
  // for progress
  char num[100];
  sprintf(num,"%d",static_cast<int>(this->LocalGenerators.size()));
  this->GetCMakeInstance()->AddCacheEntry
    ("CMAKE_NUMBER_OF_LOCAL_GENERATORS", num,
     "number of local generators", cmState::INTERNAL);

  // check for link libraries and include directories containing "NOTFOUND"
  // and for infinite loops
  this->CheckLocalGenerators();

  // at this point this->LocalGenerators has been filled,
  // so create the map from project name to vector of local generators
  this->FillProjectMap();

  if ( this->CMakeInstance->GetWorkingMode() == cmake::NORMAL_MODE)
    {
    std::ostringstream msg;
    if(cmSystemTools::GetErrorOccuredFlag())
      {
      msg << "Configuring incomplete, errors occurred!";
      const char* logs[] = {"CMakeOutput.log", "CMakeError.log", 0};
      for(const char** log = logs; *log; ++log)
        {
        std::string f = this->CMakeInstance->GetHomeOutputDirectory();
        f += this->CMakeInstance->GetCMakeFilesDirectory();
        f += "/";
        f += *log;
        if(cmSystemTools::FileExists(f.c_str()))
          {
          msg << "\nSee also \"" << f << "\".";
          }
        }
      }
    else
      {
      msg << "Configuring done";
      }
    this->CMakeInstance->UpdateProgress(msg.str().c_str(), -1);
    }
}